

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O0

void __thiscall
deci_FlexLexer::deci_FlexLexer(deci_FlexLexer *this,istream *arg_yyin,ostream *arg_yyout)

{
  streambuf *psVar1;
  ostream *arg_yyout_local;
  istream *arg_yyin_local;
  deci_FlexLexer *this_local;
  
  FlexLexer::FlexLexer(&this->super_FlexLexer);
  (this->super_FlexLexer)._vptr_FlexLexer = (_func_int **)&PTR__deci_FlexLexer_0013ac78;
  psVar1 = (streambuf *)std::ios::rdbuf();
  std::istream::istream(&this->yyin,psVar1);
  psVar1 = (streambuf *)std::ios::rdbuf();
  std::ostream::ostream(&this->yyout,psVar1);
  ctor_common(this);
  return;
}

Assistant:

yyFlexLexer::yyFlexLexer( std::istream& arg_yyin, std::ostream& arg_yyout ):
	yyin(arg_yyin.rdbuf()),
	yyout(arg_yyout.rdbuf())
{
	ctor_common();
}